

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ExprNodePtr __thiscall punky::par::Parser::parse_call_expression(Parser *this,ExprNodePtr *function)

{
  ExprNode *pEVar1;
  optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
  *in_RDX;
  bool bVar2;
  OptCallArgs arguments;
  Token call_tok;
  undefined1 auStack_68 [32];
  const_iterator local_48;
  long local_38 [3];
  
  auStack_68._24_4_ =
       *(undefined4 *)
        &function[6]._M_t.
         super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>.
         _M_t.
         super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>.
         super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl;
  local_38[2]._0_1_ = 0;
  bVar2 = *(char *)&function[0xb]._M_t.
                    super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>
                    .super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl == '\x01';
  if (bVar2) {
    local_48._M_current = (char *)local_38;
    pEVar1 = function[7]._M_t.
             super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>
             ._M_t.
             super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>
             .super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pEVar1,
               (long)&((function[8]._M_t.
                        super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>
                        .super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl)->
                      super_AstNode)._vptr_AstNode + (long)&(pEVar1->super_AstNode)._vptr_AstNode);
  }
  local_38[2]._0_1_ = bVar2;
  parse_call_arguments((Parser *)auStack_68);
  std::
  make_unique<punky::ast::CallExpression,punky::tok::Token&,std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::allocator<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>>>,std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::allocator<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>>>>>>>
            ((Token *)(auStack_68 + 0x10),
             (unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_> *)
             (auStack_68 + 0x18),in_RDX);
  (this->m_lex).m_line._M_dataplus._M_p = (pointer)auStack_68._16_8_;
  if (auStack_68[8] == '\x01') {
    auStack_68[8] = '\0';
    std::
    unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>
                   *)auStack_68);
  }
  if ((undefined1)local_38[2] == '\x01') {
    local_38[2]._0_1_ = 0;
    if ((long *)local_48._M_current != local_38) {
      operator_delete(local_48._M_current,local_38[0] + 1);
    }
  }
  return (__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
          )(__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
            )this;
}

Assistant:

auto Parser::parse_call_expression(ast::ExprNodePtr function) -> ast::ExprNodePtr
{
    auto call_tok  = m_curr_tok;
    auto arguments = parse_call_arguments();
    return std::make_unique<ast::CallExpression>(call_tok,
                                                 std::move(function), std::move(arguments));
}